

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# which.cpp
# Opt level: O2

string * fs_which_abi_cxx11_(string *__return_storage_ptr__,string_view name,string_view path,
                            bool find_all)

{
  undefined1 auVar1 [16];
  string_view path_00;
  string_view path_01;
  string_view path_02;
  string_view path_03;
  bool bVar2;
  char cVar3;
  long lVar4;
  long lVar5;
  string_view name_00;
  string_view path_04;
  string_view path_05;
  basic_string_view<char,_std::char_traits<char>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view fname;
  string_view fname_00;
  size_t in_stack_fffffffffffffeb8;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  string paths;
  string t;
  string r;
  string n;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((path._M_len == 0) || (bVar2 = fs_is_dir(path), bVar2)) {
    local_130._M_len = name._M_len;
    local_130._M_str = name._M_str;
    local_a0._M_len = path._M_len;
    local_a0._M_str = path._M_str;
    fs_parent_abi_cxx11_(&paths,name);
    bVar2 = std::operator!=(&paths,".");
    if (bVar2) {
      std::__cxx11::string::~string((string *)&paths);
    }
    else {
      __x = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_130,0,2);
      __y._M_str = "./";
      __y._M_len = 2;
      bVar2 = std::operator==(__x,__y);
      std::__cxx11::string::~string((string *)&paths);
      if (!bVar2) {
        if (local_a0._M_len == 0) {
          name_00._M_str = "PATH";
          name_00._M_len = 4;
          fs_getenv_abi_cxx11_(&paths,name_00);
        }
        else {
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&paths,&local_a0,(allocator<char> *)&n);
        }
        if (paths._M_string_length != 0) {
          path_01._M_str = (char *)__return_storage_ptr__;
          path_01._M_len = in_stack_fffffffffffffeb8;
          fs_as_posix_abi_cxx11_(path_01);
          std::__cxx11::string::operator=((string *)&paths,(string *)&n);
          std::__cxx11::string::~string((string *)&n);
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&n,&local_130,(allocator<char> *)&r);
          r._M_dataplus._M_p = (pointer)&r.field_2;
          r._M_string_length = 0;
          lVar5 = 0;
          r.field_2._M_local_buf[0] = '\0';
          t._M_dataplus._M_p = (pointer)&t.field_2;
          t._M_string_length = 0;
          t.field_2._M_local_buf[0] = '\0';
          do {
            cVar3 = fs_pathsep();
            lVar4 = std::__cxx11::string::find((char)&paths,(ulong)(uint)(int)cVar3);
            if (lVar4 != lVar5 || lVar4 == -1) {
              std::__cxx11::string::substr((ulong)&dir,(ulong)&paths);
              std::operator+(&local_70,&dir,"/");
              std::operator+(&local_50,&local_70,&n);
              std::__cxx11::string::operator=((string *)&r,(string *)&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_70);
              path_04._M_str = r._M_dataplus._M_p;
              path_04._M_len = r._M_string_length;
              bVar2 = fs_is_file(path_04);
              if ((bVar2) &&
                 (path_05._M_str = r._M_dataplus._M_p, path_05._M_len = r._M_string_length,
                 bVar2 = fs_is_exe(path_05), bVar2)) {
                if (!find_all) {
                  path_02._M_str = (char *)__return_storage_ptr__;
                  path_02._M_len = in_stack_fffffffffffffeb8;
                  fs_as_posix_abi_cxx11_(path_02);
                  std::__cxx11::string::~string((string *)&dir);
                  goto LAB_0010b599;
                }
                cVar3 = fs_pathsep();
                std::operator+(&local_50,&r,cVar3);
                std::__cxx11::string::append((string *)&t);
                std::__cxx11::string::~string((string *)&local_50);
              }
              std::__cxx11::string::~string((string *)&dir);
              if (lVar4 == -1) goto LAB_0010b4a6;
            }
            lVar5 = lVar4 + 1;
          } while( true );
        }
        auVar1._4_4_ = paths._M_dataplus._M_p._4_4_;
        auVar1._0_4_ = paths._M_dataplus._M_p._0_4_;
        n._M_string_length = std::_V2::generic_category();
        n._M_dataplus._M_p._0_4_ = 0x14;
        auVar1._8_8_ = 0;
        fname_00._M_str = "fs_which_generic";
        fname_00._M_len = 0x10;
        fs_print_error((string_view)(auVar1 << 0x40),fname_00,(error_code *)&n);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        goto LAB_0010b5ba;
      }
    }
    path_03._M_str = local_130._M_str;
    path_03._M_len = local_130._M_len;
    bVar2 = fs_is_exe(path_03);
    if (bVar2) {
      path_00._M_str = (char *)__return_storage_ptr__;
      path_00._M_len = in_stack_fffffffffffffeb8;
      fs_as_posix_abi_cxx11_(path_00);
      return __return_storage_ptr__;
    }
  }
  else {
    paths._M_string_length = std::_V2::generic_category();
    paths._M_dataplus._M_p._0_4_ = 0x14;
    fname._M_str = "fs_which";
    fname._M_len = 8;
    fs_print_error(path,fname,(error_code *)&paths);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
LAB_0010b4a6:
  if ((find_all) && (t._M_string_length != 0)) {
    std::__cxx11::string::pop_back();
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)t._M_dataplus._M_p == &t.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(t.field_2._M_allocated_capacity._1_7_,t.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = t.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = t._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(t.field_2._M_allocated_capacity._1_7_,t.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = t._M_string_length;
    t._M_string_length = 0;
    t.field_2._M_local_buf[0] = '\0';
    t._M_dataplus._M_p = (pointer)&t.field_2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
LAB_0010b599:
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::~string((string *)&r);
  std::__cxx11::string::~string((string *)&n);
LAB_0010b5ba:
  std::__cxx11::string::~string((string *)&paths);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_which(std::string_view name, std::string_view path, const bool find_all)
{
  // find an executable file "name" under each path in
  // environment variable PATH or "path" if specified

  if (!path.empty() && !fs_is_dir(path)){
    fs_print_error(path, __func__, std::make_error_code(std::errc::not_a_directory));
    return {};
  }

#if defined(_WIN32)
  // use SearchPathA, even though the generic method works.
  // This is because SearchPathA uses registry preferences that the generic method ignores.

  if(find_all)
    return fs_which_generic(name, path, true);

  std::string r(fs_get_max_path(), '\0');
  DWORD L;

  // https://learn.microsoft.com/en-us/windows/win32/api/processenv/nf-processenv-searchpatha
  if (path.empty())
    L = SearchPathA(nullptr, name.data(), ".exe", static_cast<DWORD>(r.length()), r.data(), nullptr);
  else
    L = SearchPathA(path.data(), name.data(), ".exe", static_cast<DWORD>(r.length()), r.data(), nullptr);

  if(L == 0 && GetLastError() == ERROR_FILE_NOT_FOUND)
    return {};

  if(L == 0 || L >= r.length()){
    fs_print_error(name, __func__);
    return {};
  }
  r.resize(L);

  if(fs_trace) std::cout << "TRACE: which: SearchPathA: " << r << "  length " << L << "\n";
  if(!fs_is_exe(r))
    return {};

  return fs_as_posix(r);

#else
  return fs_which_generic(name, path, find_all);
#endif
}